

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O0

int Fra_FraigInductionTest(char *pFileName,Fra_Ssw_t *pParams)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Aig_Obj_t *pObj_00;
  int iVar4;
  int iVar5;
  Aig_Man_t *pManAig;
  Aig_Man_t *p;
  char *__filename;
  FILE *__stream;
  Aig_Obj_t *pObj_01;
  undefined8 uVar6;
  uint local_60;
  int local_5c;
  int Counter;
  int i;
  int *pNum2Id;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Man_t *pMan;
  char *pFilePairs;
  FILE *pFile;
  Fra_Ssw_t *pParams_local;
  char *pFileName_local;
  
  local_60 = 0;
  pManAig = Saig_ManReadBlif(pFileName);
  if (pManAig == (Aig_Man_t *)0x0) {
    pFileName_local._4_4_ = 0;
  }
  else {
    p = Fra_FraigInduction(pManAig,pParams);
    if (p == (Aig_Man_t *)0x0) {
      Aig_ManStop(pManAig);
      pFileName_local._4_4_ = 0;
    }
    else {
      if (pParams->fVerbose != 0) {
        printf("Original AIG: ");
        Aig_ManPrintStats(pManAig);
        printf("Reduced  AIG: ");
        Aig_ManPrintStats(p);
      }
      Aig_ManStop(p);
      pvVar3 = pManAig->pData;
      __filename = Aig_FileNameGenericAppend(pFileName,".pairs");
      __stream = fopen(__filename,"w");
      for (local_5c = 0; iVar4 = Vec_PtrSize(pManAig->vObjs), local_5c < iVar4;
          local_5c = local_5c + 1) {
        pObj_01 = (Aig_Obj_t *)Vec_PtrEntry(pManAig->vObjs,local_5c);
        if ((pObj_01 != (Aig_Obj_t *)0x0) &&
           (pObj_00 = pManAig->pReprs[pObj_01->Id], pObj_00 != (Aig_Obj_t *)0x0)) {
          uVar1 = *(uint *)((long)pvVar3 + (long)pObj_01->Id * 4);
          uVar2 = *(uint *)((long)pvVar3 + (long)pObj_00->Id * 4);
          iVar4 = Aig_ObjPhase(pObj_01);
          iVar5 = Aig_ObjPhase(pObj_00);
          uVar6 = 0x2b;
          if (iVar4 != iVar5) {
            uVar6 = 0x2d;
          }
          fprintf(__stream,"%d %d %c\n",(ulong)uVar1,(ulong)uVar2,uVar6);
          local_60 = local_60 + 1;
        }
      }
      fclose(__stream);
      if (pParams->fVerbose != 0) {
        printf("Result: %d pairs of seq equiv nodes are written into file \"%s\".\n",(ulong)local_60
               ,__filename);
      }
      Aig_ManStop(pManAig);
      pFileName_local._4_4_ = 1;
    }
  }
  return pFileName_local._4_4_;
}

Assistant:

int Fra_FraigInductionTest( char * pFileName, Fra_Ssw_t * pParams )
{
    FILE * pFile;
    char * pFilePairs;
    Aig_Man_t * pMan, * pNew;
    Aig_Obj_t * pObj, * pRepr;
    int * pNum2Id;
    int i, Counter = 0;
    pMan = Saig_ManReadBlif( pFileName );
    if ( pMan == NULL )
        return 0;
    // perform seq SAT sweeping
    pNew = Fra_FraigInduction( pMan, pParams );
    if ( pNew == NULL )
    {
        Aig_ManStop( pMan );
        return 0;
    }
    if ( pParams->fVerbose )
    {
        printf( "Original AIG: " );
        Aig_ManPrintStats( pMan );
        printf( "Reduced  AIG: " );
        Aig_ManPrintStats( pNew );
    }
    Aig_ManStop( pNew );
    pNum2Id = (int *)pMan->pData;
    // write the output file
    pFilePairs = Aig_FileNameGenericAppend( pFileName, ".pairs" );
    pFile = fopen( pFilePairs, "w" );
    Aig_ManForEachObj( pMan, pObj, i )
        if ( (pRepr = pMan->pReprs[pObj->Id]) )
        {
            fprintf( pFile, "%d %d %c\n", pNum2Id[pObj->Id], pNum2Id[pRepr->Id], (Aig_ObjPhase(pObj) ^ Aig_ObjPhase(pRepr))? '-' : '+' );
            Counter++;
        }
    fclose( pFile );
    if ( pParams->fVerbose )
    {
        printf( "Result: %d pairs of seq equiv nodes are written into file \"%s\".\n", Counter, pFilePairs );
    }
    Aig_ManStop( pMan );
    return 1;
}